

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# timer_queue.hpp
# Opt level: O2

void __thiscall
asio::detail::
timer_queue<asio::detail::chrono_time_traits<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>_>_>
::down_heap(timer_queue<asio::detail::chrono_time_traits<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>_>_>
            *this,size_t index)

{
  pointer phVar1;
  ulong uVar2;
  ulong uVar3;
  ulong index2;
  
  while( true ) {
    phVar1 = (this->heap_).
             super__Vector_base<asio::detail::timer_queue<asio::detail::chrono_time_traits<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>_>_>::heap_entry,_std::allocator<asio::detail::timer_queue<asio::detail::chrono_time_traits<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>_>_>::heap_entry>_>
             ._M_impl.super__Vector_impl_data._M_start;
    index2 = index * 2 + 1;
    uVar3 = (long)(this->heap_).
                  super__Vector_base<asio::detail::timer_queue<asio::detail::chrono_time_traits<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>_>_>::heap_entry,_std::allocator<asio::detail::timer_queue<asio::detail::chrono_time_traits<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>_>_>::heap_entry>_>
                  ._M_impl.super__Vector_impl_data._M_finish - (long)phVar1 >> 4;
    if (uVar3 <= index2) {
      return;
    }
    uVar2 = index * 2 + 2;
    if ((uVar2 != uVar3) && (phVar1[uVar2].time_.__d.__r <= phVar1[index2].time_.__d.__r)) {
      index2 = uVar2;
    }
    if (phVar1[index].time_.__d.__r < phVar1[index2].time_.__d.__r) break;
    swap_heap(this,index,index2);
    index = index2;
  }
  return;
}

Assistant:

void down_heap(std::size_t index)
  {
    std::size_t child = index * 2 + 1;
    while (child < heap_.size())
    {
      std::size_t min_child = (child + 1 == heap_.size()
          || Time_Traits::less_than(
            heap_[child].time_, heap_[child + 1].time_))
        ? child : child + 1;
      if (Time_Traits::less_than(heap_[index].time_, heap_[min_child].time_))
        break;
      swap_heap(index, min_child);
      index = min_child;
      child = index * 2 + 1;
    }
  }